

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseBalancedChunkMemoryRecover
              (xmlDocPtr doc,xmlSAXHandlerPtr sax,void *user_data,int depth,xmlChar *string,
              xmlNodePtr *listOut,int recover)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlNodePtr cur;
  int iVar1;
  
  if (listOut != (xmlNodePtr *)0x0) {
    *listOut = (xmlNodePtr)0x0;
  }
  if (string == (xmlChar *)0x0) {
    return 0x73;
  }
  ctxt = xmlNewSAXParserCtxt(sax,user_data);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return 2;
  }
  xmlCtxtInitializeLate(ctxt);
  ctxt->depth = depth;
  ctxt->myDoc = doc;
  if (recover != 0) {
    *(byte *)&ctxt->options = (byte)ctxt->options | 1;
    ctxt->recovery = 1;
  }
  input = xmlNewStringInputStream(ctxt,string);
  if (input != (xmlParserInputPtr)0x0) {
    cur = xmlCtxtParseContentInternal(ctxt,input,0,1);
    if (listOut == (xmlNodePtr *)0x0) {
      xmlFreeNodeList(cur);
    }
    else {
      *listOut = cur;
    }
    iVar1 = 0;
    if (ctxt->wellFormed != 0) goto LAB_0013dbd5;
  }
  iVar1 = ctxt->errNo;
LAB_0013dbd5:
  xmlFreeInputStream(input);
  xmlFreeParserCtxt(ctxt);
  return iVar1;
}

Assistant:

int
xmlParseBalancedChunkMemoryRecover(xmlDocPtr doc, xmlSAXHandlerPtr sax,
     void *user_data, int depth, const xmlChar *string, xmlNodePtr *listOut,
     int recover) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlNodePtr list;
    int ret;

    if (listOut != NULL)
        *listOut = NULL;

    if (string == NULL)
        return(XML_ERR_ARGUMENT);

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    xmlCtxtInitializeLate(ctxt);

    ctxt->depth = depth;
    ctxt->myDoc = doc;
    if (recover) {
        ctxt->options |= XML_PARSE_RECOVER;
        ctxt->recovery = 1;
    }

    input = xmlNewStringInputStream(ctxt, string);
    if (input == NULL) {
        ret = ctxt->errNo;
        goto error;
    }

    list = xmlCtxtParseContentInternal(ctxt, input, /* hasTextDecl */ 0, 1);
    if (listOut != NULL)
        *listOut = list;
    else
        xmlFreeNodeList(list);

    if (!ctxt->wellFormed)
        ret = ctxt->errNo;
    else
        ret = XML_ERR_OK;

error:
    xmlFreeInputStream(input);
    xmlFreeParserCtxt(ctxt);
    return(ret);
}